

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O2

void __thiscall
google::protobuf::util::anon_unknown_0::ConvertDescriptorToTypeTest_TestJsonName_Test::TestBody
          (ConvertDescriptorToTypeTest_TestJsonName_Test *this)

{
  Descriptor *pDVar1;
  Field *pFVar2;
  Descriptor *pDVar3;
  Descriptor *in_R8;
  char *message;
  string_view url_prefix;
  string_view name;
  string_view url_prefix_00;
  string_view name_00;
  AssertHelper local_120;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  AssertionResult gtest_ar;
  Type type;
  
  pDVar1 = proto2_unittest::TestAllTypes::GetDescriptor();
  url_prefix._M_str = (char *)pDVar1;
  url_prefix._M_len = (size_t)"type.googleapis.com";
  ConvertDescriptorToType(&type,(util *)&DAT_00000013,url_prefix,in_R8);
  name._M_str = (char *)pDVar1;
  name._M_len = (size_t)"optional_int32";
  pFVar2 = FindField((anon_unknown_0 *)&type,(Type *)&DAT_0000000e,name);
  pDVar1 = (Descriptor *)
           ((ulong)(pFVar2->field_0)._impl_.json_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"optionalInt32\"",
             "FindField(type, \"optional_int32\")->json_name()",(char (*) [14])"optionalInt32",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pDVar1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pDVar1 = (Descriptor *)(anon_var_dwarf_651463 + 5);
    }
    else {
      pDVar1 = *(Descriptor **)
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x2db,(char *)pDVar1);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pDVar3 = proto3::TestCustomJsonName::GetDescriptor();
  url_prefix_00._M_str = (char *)pDVar3;
  url_prefix_00._M_len = (size_t)"type.googleapis.com";
  ConvertDescriptorToType((Type *)&gtest_ar,(util *)&DAT_00000013,url_prefix_00,pDVar1);
  Type::operator=(&type,(Type *)&gtest_ar);
  Type::~Type((Type *)&gtest_ar);
  name_00._M_str = (char *)pDVar3;
  name_00._M_len = (size_t)"value";
  pFVar2 = FindField((anon_unknown_0 *)&type,(Type *)&DAT_00000005,name_00);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"@value\"","FindField(type, \"value\")->json_name()",
             (char (*) [7])"@value",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(pFVar2->field_0)._impl_.json_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x2df,message);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  Type::~Type(&type);
  return;
}

Assistant:

TEST(ConvertDescriptorToTypeTest, TestJsonName) {
  Type type = ConvertDescriptorToType(
      kUrlPrefix, *proto2_unittest::TestAllTypes::GetDescriptor());
  EXPECT_EQ("optionalInt32", FindField(type, "optional_int32")->json_name());

  type = ConvertDescriptorToType(kUrlPrefix,
                                 *proto3::TestCustomJsonName::GetDescriptor());
  EXPECT_EQ("@value", FindField(type, "value")->json_name());
}